

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

long duckdb::BinaryLambdaWrapper::
     Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
               (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
               idx_t idx)

{
  size_type __n;
  value_type vVar1;
  value_type vVar2;
  reference pvVar3;
  reference pvVar4;
  key_type_conflict *__k;
  mapped_type *pmVar5;
  ulong uVar6;
  mapped_type mVar7;
  uint uVar8;
  value_type vVar9;
  size_type sVar10;
  key_type_conflict *__k_00;
  size_type sVar11;
  ulong uVar12;
  size_type sVar13;
  ulong uVar14;
  ulong uVar15;
  size_type sVar16;
  bool bVar17;
  allocator_type local_11a;
  allocator_type local_119;
  size_type local_118;
  long local_110;
  key_type_conflict *local_108;
  ulong local_100;
  mapped_type local_f8;
  size_type local_f0;
  vector<duckdb::vector<unsigned_long,_true>,_true> distance;
  long local_d0;
  long local_c0;
  undefined8 local_88;
  key_type_conflict *local_80;
  undefined8 local_78;
  long local_70;
  _Rb_tree<char,_std::pair<const_char,_unsigned_long>,_std::_Select1st<std::pair<const_char,_unsigned_long>_>,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
  local_68;
  idx_t inf;
  
  local_80 = right.value._0_8_;
  local_88 = left.value._8_8_;
  local_70 = left.value._0_8_;
  uVar8 = left.value._8_4_;
  uVar12 = (ulong)uVar8;
  vVar9 = uVar12;
  if (((uint)fun.result != 0) && (vVar9 = (ulong)fun.result & 0xffffffff, uVar8 != 0)) {
    local_110 = local_70;
    if ((uint)fun.result < 0xd) {
      local_110 = (long)&local_78 + 4;
    }
    local_108 = local_80;
    if (uVar8 < 0xd) {
      local_108 = (key_type_conflict *)((long)&local_88 + 4);
    }
    inf = uVar12 + vVar9 + 1;
    local_78 = fun.result;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,uVar12 + 2,&inf,
               &local_119);
    std::
    vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
    ::vector(&distance.
              super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
             ,vVar9 + 2,(value_type *)&local_68,&local_11a);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68);
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    sVar11 = 0;
    sVar13 = vVar9 + 1;
    local_100 = uVar12;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    while (bVar17 = sVar13 != 0, sVar13 = sVar13 - 1, bVar17) {
      pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::get<true>(&distance,sVar11 + 1);
      pvVar4 = vector<unsigned_long,_true>::get<true>(pvVar3,1);
      *pvVar4 = sVar11;
      sVar11 = sVar11 + 1;
    }
    __n = local_100 + 1;
    uVar12 = local_100;
    sVar10 = 1;
    while (bVar17 = uVar12 != 0, uVar12 = uVar12 - 1, bVar17) {
      pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::get<true>(&distance,1);
      pvVar4 = vector<unsigned_long,_true>::get<true>(pvVar3,sVar10 + 1);
      *pvVar4 = sVar10;
      sVar10 = sVar10 + 1;
    }
    local_d0 = 1;
    mVar7 = 0;
    uVar12 = local_100;
    while (mVar7 != vVar9) {
      __k = (key_type_conflict *)(local_110 + mVar7);
      local_f8 = mVar7 + 1;
      local_c0 = local_d0;
      local_118 = 0;
      sVar10 = 0;
      __k_00 = local_108;
      uVar14 = uVar12;
      while (bVar17 = uVar12 != 0, uVar12 = uVar12 - 1, bVar17) {
        pmVar5 = std::
                 map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                 ::operator[]((map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                               *)&local_68,__k_00);
        sVar11 = *pmVar5;
        local_f0 = sVar10 + 1;
        bVar17 = *__k != *__k_00;
        sVar16 = local_f0;
        if (bVar17) {
          sVar16 = local_118;
        }
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::get<true>(&distance,local_f8);
        pvVar4 = vector<unsigned_long,_true>::get<true>(pvVar3,local_f0);
        uVar15 = (ulong)bVar17 + *pvVar4;
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::get<true>(&distance,mVar7 + 2);
        pvVar4 = vector<unsigned_long,_true>::get<true>(pvVar3,local_f0);
        vVar1 = *pvVar4;
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::get<true>(&distance,local_f8);
        pvVar4 = vector<unsigned_long,_true>::get<true>(pvVar3,sVar10 + 2);
        vVar2 = *pvVar4;
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::get<true>(&distance,sVar11);
        pvVar4 = vector<unsigned_long,_true>::get<true>(pvVar3,local_118);
        uVar6 = ((*pvVar4 - local_118) - sVar11) + local_c0;
        uVar14 = vVar2 + 1;
        if (uVar6 <= vVar2 + 1) {
          uVar14 = uVar6;
        }
        uVar6 = vVar1 + 1;
        if (uVar14 <= vVar1 + 1) {
          uVar6 = uVar14;
        }
        if (uVar6 <= uVar15) {
          uVar15 = uVar6;
        }
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::get<true>(&distance,mVar7 + 2);
        pvVar4 = vector<unsigned_long,_true>::get<true>(pvVar3,sVar10 + 2);
        *pvVar4 = uVar15;
        local_c0 = local_c0 + 1;
        __k_00 = __k_00 + 1;
        sVar10 = local_f0;
        uVar14 = local_100;
        local_118 = sVar16;
      }
      pmVar5 = std::
               map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
               ::operator[]((map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                             *)&local_68,__k);
      *pmVar5 = local_f8;
      local_d0 = local_d0 + 1;
      mVar7 = local_f8;
      uVar12 = uVar14;
    }
    pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::get<true>(&distance,vVar9 + 1);
    pvVar4 = vector<unsigned_long,_true>::get<true>(pvVar3,__n);
    vVar9 = *pvVar4;
    std::
    _Rb_tree<char,_std::pair<const_char,_unsigned_long>,_std::_Select1st<std::pair<const_char,_unsigned_long>_>,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
    ::~_Rb_tree(&local_68);
    std::
    vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
    ::~vector(&distance.
               super_vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
             );
  }
  return vVar9;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}